

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall
crnlib::mip_level::assign
          (mip_level *this,image_u8 *p,pixel_format fmt,orientation_flags_t orient_flags)

{
  pixel_format pVar1;
  pixel_format pVar2;
  
  clear(this);
  this->m_pImage = p;
  this->m_width = p->m_width;
  this->m_height = p->m_height;
  this->m_orient_flags = orient_flags;
  if (fmt == PIXEL_FMT_INVALID) {
    if ((p->m_comp_flags & 0x10) == 0) {
      pVar1 = PIXEL_FMT_R8G8B8;
      pVar2 = PIXEL_FMT_A8R8G8B8;
    }
    else {
      pVar1 = PIXEL_FMT_L8;
      pVar2 = PIXEL_FMT_A8L8;
    }
    if ((p->m_comp_flags & 8) == 0) {
      pVar2 = pVar1;
    }
    this->m_format = pVar2;
  }
  else {
    this->m_format = fmt;
  }
  this->m_comp_flags = p->m_comp_flags;
  return;
}

Assistant:

void mip_level::assign(image_u8* p, pixel_format fmt, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(p);

  clear();

  m_pImage = p;

  m_width = p->get_width();
  m_height = p->get_height();
  m_orient_flags = orient_flags;

  if (fmt != PIXEL_FMT_INVALID)
    m_format = fmt;
  else {
    if (p->is_grayscale())
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8L8 : PIXEL_FMT_L8;
    else
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;
  }

  m_comp_flags = p->get_comp_flags();  //pixel_format_helpers::get_component_flags(m_format);
}